

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

void t1_parse_font_matrix(T1_Face face,T1_Loader loader)

{
  FT_Int FVar1;
  FT_Long FVar2;
  long b_;
  FT_Long local_58;
  FT_Long local_50;
  FT_Long local_48;
  long local_40;
  FT_Long local_38;
  long local_30;
  
  FVar1 = (*(loader->parser).root.funcs.to_fixed_array)((PS_Parser)loader,6,&local_58,3);
  if (5 < FVar1) {
    b_ = -local_40;
    if (0 < local_40) {
      b_ = local_40;
    }
    if (local_40 != 0) {
      if (b_ != 0x10000) {
        FVar2 = FT_DivFix(1000,b_);
        (face->root).units_per_EM = (FT_UShort)FVar2;
        local_58 = FT_DivFix(local_58,b_);
        local_50 = FT_DivFix(local_50,b_);
        local_48 = FT_DivFix(local_48,b_);
        local_38 = FT_DivFix(local_38,b_);
        local_30 = FT_DivFix(local_30,b_);
        local_40 = (ulong)(-1 < local_40) * 0x20000 + -0x10000;
      }
      (face->type1).font_matrix.xx = local_58;
      (face->type1).font_matrix.yx = local_50;
      (face->type1).font_matrix.xy = local_48;
      (face->type1).font_matrix.yy = local_40;
      (face->type1).font_offset.x = local_38 >> 0x10;
      (face->type1).font_offset.y = local_30 >> 0x10;
      return;
    }
  }
  (loader->parser).root.error = 3;
  return;
}

Assistant:

static void
  t1_parse_font_matrix( T1_Face    face,
                        T1_Loader  loader )
  {
    T1_Parser   parser = &loader->parser;
    FT_Matrix*  matrix = &face->type1.font_matrix;
    FT_Vector*  offset = &face->type1.font_offset;
    FT_Face     root   = (FT_Face)&face->root;
    FT_Fixed    temp[6];
    FT_Fixed    temp_scale;
    FT_Int      result;


    /* input is scaled by 1000 to accommodate default FontMatrix */
    result = T1_ToFixedArray( parser, 6, temp, 3 );

    if ( result < 6 )
    {
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    temp_scale = FT_ABS( temp[3] );

    if ( temp_scale == 0 )
    {
      FT_ERROR(( "t1_parse_font_matrix: invalid font matrix\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* atypical case */
    if ( temp_scale != 0x10000L )
    {
      /* set units per EM based on FontMatrix values */
      root->units_per_EM = (FT_UShort)FT_DivFix( 1000, temp_scale );

      temp[0] = FT_DivFix( temp[0], temp_scale );
      temp[1] = FT_DivFix( temp[1], temp_scale );
      temp[2] = FT_DivFix( temp[2], temp_scale );
      temp[4] = FT_DivFix( temp[4], temp_scale );
      temp[5] = FT_DivFix( temp[5], temp_scale );
      temp[3] = temp[3] < 0 ? -0x10000L : 0x10000L;
    }

    matrix->xx = temp[0];
    matrix->yx = temp[1];
    matrix->xy = temp[2];
    matrix->yy = temp[3];

    /* note that the offsets must be expressed in integer font units */
    offset->x = temp[4] >> 16;
    offset->y = temp[5] >> 16;
  }